

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysc_must ** lysc_node_musts_p(lysc_node *node)

{
  uint16_t uVar1;
  lysc_node *node_local;
  
  if (node == (lysc_node *)0x0) {
    node_local = (lysc_node *)0x0;
  }
  else {
    uVar1 = node->nodetype;
    if (uVar1 == 1) {
      node_local = (lysc_node *)&node[1].module;
    }
    else if (uVar1 == 4) {
      node_local = node + 1;
    }
    else if (uVar1 == 8) {
      node_local = node + 1;
    }
    else if (uVar1 == 0x10) {
      node_local = (lysc_node *)&node[1].module;
    }
    else if ((uVar1 == 0x20) || (uVar1 == 0x60)) {
      node_local = node + 1;
    }
    else if (uVar1 == 0x400) {
      node_local = (lysc_node *)&node[1].module;
    }
    else if ((uVar1 == 0x1000) || (uVar1 == 0x2000)) {
      node_local = (lysc_node *)&node[1].module;
    }
    else {
      node_local = (lysc_node *)0x0;
    }
  }
  return (lysc_must **)node_local;
}

Assistant:

struct lysc_must **
lysc_node_musts_p(const struct lysc_node *node)
{
    if (!node) {
        return NULL;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysc_node_container *)node)->musts;
    case LYS_LEAF:
        return &((struct lysc_node_leaf *)node)->musts;
    case LYS_LEAFLIST:
        return &((struct lysc_node_leaflist *)node)->musts;
    case LYS_LIST:
        return &((struct lysc_node_list *)node)->musts;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return &((struct lysc_node_anydata *)node)->musts;
    case LYS_NOTIF:
        return &((struct lysc_node_notif *)node)->musts;
    case LYS_INPUT:
    case LYS_OUTPUT:
        return &((struct lysc_node_action_inout *)node)->musts;
    default:
        return NULL;
    }
}